

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O1

void verifyOrthonormal<float>(Matrix33<float> *A)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  Matrix33<float> tmp;
  float local_24;
  float local_20;
  float local_1c;
  float fStack_18;
  float fStack_14;
  float fStack_10;
  undefined8 local_c;
  float local_4;
  
  fVar1 = A->x[2][0];
  fVar2 = A->x[0][0];
  fVar3 = A->x[0][1];
  fVar4 = A->x[2][1];
  fVar5 = A->x[0][2];
  fVar6 = A->x[2][2];
  fVar7 = A->x[1][1];
  fVar8 = A->x[1][0];
  fVar9 = A->x[1][2];
  pfVar10 = &local_24;
  local_24 = fVar5 * fVar5 + fVar2 * fVar2 + fVar3 * fVar3;
  local_1c = fVar6 * fVar5 + fVar1 * fVar2 + fVar4 * fVar3;
  local_20 = fVar5 * fVar9 + fVar2 * fVar8 + fVar3 * fVar7;
  fStack_10 = fVar6 * fVar9 + fVar1 * fVar8 + fVar4 * fVar7;
  fStack_18 = local_20;
  fStack_14 = fVar9 * fVar9 + fVar8 * fVar8 + fVar7 * fVar7;
  local_c = CONCAT44(fStack_10,local_1c);
  local_4 = fVar6 * fVar6 + fVar1 * fVar1 + fVar4 * fVar4;
  lVar11 = 0;
  do {
    lVar12 = 0;
    do {
      if (lVar11 == lVar12) {
        if (1.1920929e-05 <= ABS(pfVar10[lVar12] + -1.0)) {
          __assert_fail("std::abs (prod[i][j] - 1) < valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x1d,"void verifyOrthonormal(const Imath_3_2::Matrix33<T> &) [T = float]");
        }
      }
      else if (1.1920929e-05 <= ABS(pfVar10[lVar12])) {
        __assert_fail("std::abs (prod[i][j]) < valueEps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x1f,"void verifyOrthonormal(const Imath_3_2::Matrix33<T> &) [T = float]");
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar11 = lVar11 + 1;
    pfVar10 = pfVar10 + 3;
  } while (lVar11 != 3);
  return;
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    const T valueEps = T (100) * std::numeric_limits<T>::epsilon ();

    const IMATH_INTERNAL_NAMESPACE::Matrix33<T> prod = A * A.transposed ();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < valueEps);
            else
                assert (std::abs (prod[i][j]) < valueEps);
        }
    }
}